

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::emplaceRealloc<slang::ast::NetAlias>
          (SmallVectorBase<slang::ast::NetAlias> *this,pointer pos,NetAlias *args)

{
  unsigned_long *puVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ValueSymbol *pVVar4;
  Expression *pEVar5;
  unsigned_long uVar6;
  NetAlias *__cur_1;
  pointer pNVar7;
  pointer pNVar8;
  pointer pNVar9;
  pointer pNVar10;
  EVP_PKEY_CTX *pEVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar11 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar11 < ctx) {
    pEVar11 = ctx;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    pEVar11 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pNVar7 = (pointer)operator_new((long)pEVar11 << 5);
  pVVar4 = (args->sym).ptr;
  pEVar5 = (args->expr).ptr;
  uVar6 = (args->bounds).second;
  puVar1 = (unsigned_long *)((long)pNVar7 + lVar12 + 0x10);
  *puVar1 = (args->bounds).first;
  puVar1[1] = uVar6;
  *(undefined8 *)((long)pNVar7 + lVar12) = pVVar4;
  ((undefined8 *)((long)pNVar7 + lVar12))[1] = pEVar5;
  pNVar10 = this->data_;
  pNVar8 = pNVar10 + this->len;
  pNVar9 = pNVar7;
  if (pNVar8 == pos) {
    for (; pNVar10 != pos; pNVar10 = pNVar10 + 1) {
      pVVar4 = (pNVar10->sym).ptr;
      pEVar5 = (pNVar10->expr).ptr;
      uVar6 = (pNVar10->bounds).second;
      (pNVar9->bounds).first = (pNVar10->bounds).first;
      (pNVar9->bounds).second = uVar6;
      (pNVar9->sym).ptr = pVVar4;
      (pNVar9->expr).ptr = pEVar5;
      pNVar9 = pNVar9 + 1;
    }
  }
  else {
    for (; pNVar10 != pos; pNVar10 = pNVar10 + 1) {
      pVVar4 = (pNVar10->sym).ptr;
      pEVar5 = (pNVar10->expr).ptr;
      uVar6 = (pNVar10->bounds).second;
      (pNVar9->bounds).first = (pNVar10->bounds).first;
      (pNVar9->bounds).second = uVar6;
      (pNVar9->sym).ptr = pVVar4;
      (pNVar9->expr).ptr = pEVar5;
      pNVar9 = pNVar9 + 1;
    }
    puVar3 = (undefined8 *)(lVar12 + (long)pNVar7);
    for (; pos != pNVar8; pos = pos + 1) {
      pVVar4 = (pos->sym).ptr;
      pEVar5 = (pos->expr).ptr;
      uVar6 = (pos->bounds).second;
      puVar3[6] = (pos->bounds).first;
      puVar3[7] = uVar6;
      puVar3[4] = pVVar4;
      puVar3[5] = pEVar5;
      puVar3 = puVar3 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar11;
  this->data_ = pNVar7;
  return (pointer)((long)pNVar7 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}